

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

void __thiscall TPZBlockDiagonal<float>::TPZBlockDiagonal(TPZBlockDiagonal<float> *this)

{
  long local_20;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBlockDiagonal_0182ed60;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  (this->fStorage).fStore = (float *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  local_20 = 0;
  TPZVec<long>::TPZVec(&this->fBlockPos,1,&local_20);
  (this->fBlockSize)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  (this->fBlockSize).fStore = (int *)0x0;
  (this->fBlockSize).fNElements = 0;
  (this->fBlockSize).fNAlloc = 0;
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal()
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	
}